

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

StructColumnReader * __thiscall
duckdb::ColumnReader::Cast<duckdb::StructColumnReader>(ColumnReader *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38 [32];
  
  if (this->column_schema->field_0x29 == '\x18') {
    return (StructColumnReader *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            (local_38,"Failed to cast column reader to type - type mismatch",&local_39);
  duckdb::InternalException::InternalException(this_00,local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const LogicalType &Type() const {
		return column_schema.type;
	}